

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

void __thiscall
EOPlus::Parser_Token_Server_Base::~Parser_Token_Server_Base(Parser_Token_Server_Base *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->_vptr_Parser_Token_Server_Base = (_func_int **)&PTR___cxa_pure_virtual_001d1708;
  pcVar2 = (this->reject_token).data.val_string._M_dataplus._M_p;
  paVar1 = &(this->reject_token).data.val_string.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>::~deque(&(this->token_buffer).c);
  return;
}

Assistant:

Parser_Token_Server_Base::~Parser_Token_Server_Base()
	{ }